

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O2

SPIRCombinedImageSampler * __thiscall
spirv_cross::Compiler::
set<spirv_cross::SPIRCombinedImageSampler,spirv_cross::SPIRCombinedImageSampler&>
          (Compiler *this,uint32_t id,SPIRCombinedImageSampler *args)

{
  SPIRCombinedImageSampler *pSVar1;
  
  ParsedIR::add_typed_id(&this->ir,TypeCombinedImageSampler,(ID)id);
  pSVar1 = variant_set<spirv_cross::SPIRCombinedImageSampler,spirv_cross::SPIRCombinedImageSampler&>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id,args);
  (pSVar1->super_IVariant).self.id = id;
  return pSVar1;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		set_initializers(var);
		return var;
	}